

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O0

bool __thiscall kj::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  char *pcVar1;
  Vector<unsigned_int> *pVVar2;
  uint *puVar3;
  size_t sVar4;
  bool bVar5;
  uint local_e4;
  uint state_1;
  uint *__end1_1;
  uint *__begin1_1;
  Vector<unsigned_int> *__range1_1;
  uint state;
  uint *__end2;
  uint *__begin2;
  Vector<unsigned_int> *__range2;
  undefined1 local_a0 [8];
  Vector<unsigned_int> oldStates;
  char c;
  char *__end1;
  char *local_60;
  char *__begin1;
  StringPtr *__range1;
  Vector<unsigned_int> scratch;
  GlobFilter *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (GlobFilter *)name.content.ptr;
  Vector<unsigned_int>::resize(&this->states,0);
  scratch.builder.disposer._4_4_ = 0;
  Vector<unsigned_int>::add<int>(&this->states,(int *)((long)&scratch.builder.disposer + 4));
  Vector<unsigned_int>::Vector((Vector<unsigned_int> *)&__range1);
  local_60 = StringPtr::begin((StringPtr *)&this_local);
  pcVar1 = StringPtr::end((StringPtr *)&this_local);
  for (; local_60 != pcVar1; local_60 = local_60 + 1) {
    oldStates.builder.disposer._7_1_ = *local_60;
    pVVar2 = mv<kj::Vector<unsigned_int>>(&this->states);
    Vector<unsigned_int>::Vector((Vector<unsigned_int> *)local_a0,pVVar2);
    pVVar2 = mv<kj::Vector<unsigned_int>>((Vector<unsigned_int> *)&__range1);
    Vector<unsigned_int>::operator=(&this->states,pVVar2);
    Vector<unsigned_int>::resize(&this->states,0);
    if ((oldStates.builder.disposer._7_1_ == '/') || (oldStates.builder.disposer._7_1_ == '\\')) {
      __range2._4_4_ = 0;
      Vector<unsigned_int>::add<int>(&this->states,(int *)((long)&__range2 + 4));
    }
    __end2 = Vector<unsigned_int>::begin((Vector<unsigned_int> *)local_a0);
    puVar3 = Vector<unsigned_int>::end((Vector<unsigned_int> *)local_a0);
    for (; __end2 != puVar3; __end2 = __end2 + 1) {
      applyState(this,oldStates.builder.disposer._7_1_,*__end2);
    }
    pVVar2 = mv<kj::Vector<unsigned_int>>((Vector<unsigned_int> *)local_a0);
    Vector<unsigned_int>::operator=((Vector<unsigned_int> *)&__range1,pVVar2);
    Vector<unsigned_int>::~Vector((Vector<unsigned_int> *)local_a0);
  }
  __end1_1 = Vector<unsigned_int>::begin(&this->states);
  puVar3 = Vector<unsigned_int>::end(&this->states);
  do {
    if (__end1_1 == puVar3) {
      name_local.content.size_._7_1_ = 0;
LAB_008627f1:
      Vector<unsigned_int>::~Vector((Vector<unsigned_int> *)&__range1);
      return (bool)(name_local.content.size_._7_1_ & 1);
    }
    local_e4 = *__end1_1;
    while( true ) {
      sVar4 = String::size(&this->pattern);
      bVar5 = false;
      if (local_e4 < sVar4) {
        pcVar1 = String::operator[](&this->pattern,(ulong)local_e4);
        bVar5 = *pcVar1 == '*';
      }
      if (!bVar5) break;
      local_e4 = local_e4 + 1;
    }
    sVar4 = String::size(&this->pattern);
    if (local_e4 == sVar4) {
      name_local.content.size_._7_1_ = 1;
      goto LAB_008627f1;
    }
    __end1_1 = __end1_1 + 1;
  } while( true );
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}